

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs_helpers.cpp
# Opt level: O0

optional<std::filesystem::perms> InterpretPermString(string *s)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  undefined8 in_stack_ffffffffffffffc8;
  perms *in_stack_ffffffffffffffd0;
  _Optional_payload_base<std::filesystem::perms> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = std::operator==(in_RDI,(char *)in_stack_ffffffffffffffd0);
  if (bVar1) {
    std::filesystem::operator|
              ((perms)((ulong)in_stack_ffffffffffffffc8 >> 0x20),(perms)in_stack_ffffffffffffffc8);
    std::optional<std::filesystem::perms>::optional<std::filesystem::perms,_true>
              ((optional<std::filesystem::perms> *)in_RDI,in_stack_ffffffffffffffd0);
  }
  else {
    bVar1 = std::operator==(in_RDI,(char *)in_stack_ffffffffffffffd0);
    if (bVar1) {
      std::filesystem::operator|
                ((perms)((ulong)in_stack_ffffffffffffffc8 >> 0x20),(perms)in_stack_ffffffffffffffc8)
      ;
      std::filesystem::operator|
                ((perms)((ulong)in_stack_ffffffffffffffc8 >> 0x20),(perms)in_stack_ffffffffffffffc8)
      ;
      std::optional<std::filesystem::perms>::optional<std::filesystem::perms,_true>
                ((optional<std::filesystem::perms> *)in_RDI,in_stack_ffffffffffffffd0);
    }
    else {
      bVar1 = std::operator==(in_RDI,(char *)in_stack_ffffffffffffffd0);
      if (bVar1) {
        std::filesystem::operator|
                  ((perms)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                   (perms)in_stack_ffffffffffffffc8);
        std::filesystem::operator|
                  ((perms)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                   (perms)in_stack_ffffffffffffffc8);
        std::filesystem::operator|
                  ((perms)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                   (perms)in_stack_ffffffffffffffc8);
        std::optional<std::filesystem::perms>::optional<std::filesystem::perms,_true>
                  ((optional<std::filesystem::perms> *)in_RDI,in_stack_ffffffffffffffd0);
      }
      else {
        std::optional<std::filesystem::perms>::optional
                  ((optional<std::filesystem::perms> *)&local_10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (optional<std::filesystem::perms>)local_10;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<fs::perms> InterpretPermString(const std::string& s)
{
    if (s == "owner") {
        return fs::perms::owner_read | fs::perms::owner_write;
    } else if (s == "group") {
        return fs::perms::owner_read | fs::perms::owner_write |
               fs::perms::group_read;
    } else if (s == "all") {
        return fs::perms::owner_read | fs::perms::owner_write |
               fs::perms::group_read |
               fs::perms::others_read;
    } else {
        return std::nullopt;
    }
}